

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O1

opj_tgt_tree_t * tgt_create(int numleafsh,int numleafsv)

{
  int iVar1;
  opj_tgt_node *poVar2;
  uint uVar3;
  uint uVar4;
  opj_tgt_tree_t *__ptr;
  opj_tgt_node_t *poVar5;
  OPJ_UINT32 *pOVar6;
  opj_tgt_node *poVar7;
  opj_tgt_node_t *poVar8;
  uint uVar9;
  opj_tgt_node *poVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int nplv [32];
  int nplh [32];
  uint local_138 [32];
  int local_b8 [34];
  
  __ptr = (opj_tgt_tree_t *)malloc(0x20);
  if (__ptr != (opj_tgt_tree_t *)0x0) {
    __ptr->numleafsh = numleafsh;
    __ptr->numleafsv = numleafsv;
    local_b8[0] = numleafsh;
    local_138[0] = numleafsv;
    __ptr->numnodes = 0;
    lVar13 = -1;
    uVar4 = 0;
    do {
      uVar3 = uVar4;
      iVar1 = local_b8[lVar13 + 1];
      uVar4 = local_138[lVar13 + 1];
      iVar14 = uVar4 * iVar1;
      local_b8[lVar13 + 2] = (iVar1 - (iVar1 + 1 >> 0x1f)) + 1 >> 1;
      local_138[lVar13 + 2] = (int)((uVar4 - ((int)(uVar4 + 1) >> 0x1f)) + 1) >> 1;
      uVar4 = uVar3 + iVar14;
      lVar13 = lVar13 + 1;
    } while (1 < iVar14);
    __ptr->numnodes = uVar4;
    if (uVar4 != 0) {
      poVar5 = (opj_tgt_node_t *)calloc((ulong)uVar4,0x18);
      __ptr->nodes = poVar5;
      if (poVar5 != (opj_tgt_node_t *)0x0) {
        poVar8 = poVar5;
        if (lVar13 != 0) {
          poVar7 = poVar5 + (uint)(numleafsv * numleafsh);
          lVar11 = 0;
          poVar10 = poVar7;
          do {
            uVar4 = local_138[lVar11];
            if (0 < (int)uVar4) {
              iVar1 = local_b8[lVar11];
              uVar9 = 0;
              do {
                iVar12 = iVar1 + 2;
                if (0 < iVar1) {
                  do {
                    poVar8->parent = poVar10;
                    if (iVar12 == 3) {
                      poVar8 = poVar8 + 1;
                    }
                    else {
                      poVar8[1].parent = poVar10;
                      poVar8 = poVar8 + 2;
                    }
                    poVar10 = poVar10 + 1;
                    iVar12 = iVar12 + -2;
                  } while (2 < iVar12);
                }
                poVar2 = poVar7 + iVar1;
                if (uVar9 == uVar4 - 1 || (uVar9 & 1) != 0) {
                  poVar2 = poVar10;
                  poVar7 = poVar10;
                }
                poVar10 = poVar7;
                poVar7 = poVar2;
                uVar9 = uVar9 + 1;
              } while (uVar9 != uVar4);
            }
            lVar11 = lVar11 + 1;
          } while (lVar13 != lVar11);
        }
        poVar8->parent = (opj_tgt_node *)0x0;
        pOVar6 = &poVar5->known;
        iVar14 = uVar3 + iVar14;
        do {
          *(undefined8 *)(pOVar6 + -2) = 999;
          *pOVar6 = 0;
          pOVar6 = pOVar6 + 6;
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
        return __ptr;
      }
    }
    free(__ptr);
  }
  return (opj_tgt_tree_t *)0x0;
}

Assistant:

opj_tgt_tree_t *tgt_create(int numleafsh, int numleafsv) {
	int nplh[32];
	int nplv[32];
	opj_tgt_node_t *node = NULL;
	opj_tgt_node_t *parentnode = NULL;
	opj_tgt_node_t *parentnode0 = NULL;
	opj_tgt_tree_t *tree = NULL;
	int i, j, k;
	int numlvls;
	int n;

	tree = (opj_tgt_tree_t *) opj_malloc(sizeof(opj_tgt_tree_t));
	if(!tree) return NULL;
	tree->numleafsh = numleafsh;
	tree->numleafsv = numleafsv;

	numlvls = 0;
	nplh[0] = numleafsh;
	nplv[0] = numleafsv;
	tree->numnodes = 0;
	do {
		n = nplh[numlvls] * nplv[numlvls];
		nplh[numlvls + 1] = (nplh[numlvls] + 1) / 2;
		nplv[numlvls + 1] = (nplv[numlvls] + 1) / 2;
		tree->numnodes += n;
		++numlvls;
	} while (n > 1);
	
	/* ADD */
	if (tree->numnodes == 0) {
		opj_free(tree);
		return NULL;
	}

	tree->nodes = (opj_tgt_node_t*) opj_calloc(tree->numnodes, sizeof(opj_tgt_node_t));
	if(!tree->nodes) {
		opj_free(tree);
		return NULL;
	}

	node = tree->nodes;
	parentnode = &tree->nodes[tree->numleafsh * tree->numleafsv];
	parentnode0 = parentnode;
	
	for (i = 0; i < numlvls - 1; ++i) {
		for (j = 0; j < nplv[i]; ++j) {
			k = nplh[i];
			while (--k >= 0) {
				node->parent = parentnode;
				++node;
				if (--k >= 0) {
					node->parent = parentnode;
					++node;
				}
				++parentnode;
			}
			if ((j & 1) || j == nplv[i] - 1) {
				parentnode0 = parentnode;
			} else {
				parentnode = parentnode0;
				parentnode0 += nplh[i];
			}
		}
	}
	node->parent = 0;
	
	tgt_reset(tree);
	
	return tree;
}